

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::calculatePadding(GridAxisIrregular *this)

{
  byte local_15;
  value_type_conflict4 local_14;
  byte local_11;
  KUINT8 i;
  KUINT16 Padding;
  GridAxisIrregular *pGStack_10;
  KUINT8 NumPadding;
  GridAxisIrregular *this_local;
  
  pGStack_10 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vui16Padding);
  local_11 = (byte)((ulong)(this->super_GridAxisRegular).m_ui16NumPoints % 4);
  local_14 = 0;
  for (local_15 = 0; local_15 < local_11; local_15 = local_15 + 1) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Padding,&local_14);
  }
  return;
}

Assistant:

void GridAxisIrregular::calculatePadding()
{
    // Calculate padding needed to be on a 64 bit boundary.
    m_vui16Padding.clear();
    KUINT8 NumPadding = m_ui16NumPoints % 4;

    // Add the padding
    KUINT16 Padding = 0;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        m_vui16Padding.push_back( Padding );
    }
}